

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAML.h
# Opt level: O3

bool jaegertracing::utils::yaml::findOrDefault<bool,char[9],bool>
               (Node *node,char (*key) [9],bool *defaultValue)

{
  undefined1 uVar1;
  Node valueNode;
  Node local_38;
  as_if<bool,_void> local_18;
  
  YAML::Node::operator[]<char[9]>(&local_38,node,key);
  if ((local_38.m_isValid == true) &&
     ((local_38.m_pNode == (node *)0x0 || (*(char *)**(undefined8 **)local_38.m_pNode != '\0')))) {
    local_18.node = &local_38;
    uVar1 = YAML::as_if<bool,_void>::operator()(&local_18);
  }
  else {
    uVar1 = *defaultValue;
  }
  if (local_38.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (bool)uVar1;
}

Assistant:

ValueType findOrDefault(const YAML::Node& node,
                        const KeyType& key,
                        const DefaultValueType& defaultValue)
{
    const auto valueNode = node[key];
    if (!valueNode.IsDefined()) {
        return defaultValue;
    }
    return valueNode.template as<ValueType>();
}